

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_thread_pool.h
# Opt level: O2

bool __thiscall simple_thread_pool::TaskHandle::execute(TaskHandle *this,TaskResult *ret)

{
  atomic<simple_thread_pool::TaskStatus> *this_00;
  bool bVar1;
  uint in_EAX;
  undefined4 uStack_28;
  TaskStatus exp;
  
  _uStack_28 = (ulong)in_EAX;
  this_00 = &this->status;
  bVar1 = std::atomic<simple_thread_pool::TaskStatus>::compare_exchange_strong
                    (this_00,&exp,RUNNING,memory_order_seq_cst);
  if (bVar1) {
    std::function<void_(const_simple_thread_pool::TaskResult_&)>::operator()(&this->handler,ret);
    if (this->type == ONE_TIME) {
      LOCK();
      this_00->_M_i = DONE;
      UNLOCK();
    }
    else {
      _uStack_28 = CONCAT44(1,uStack_28);
      std::atomic<simple_thread_pool::TaskStatus>::compare_exchange_strong
                (this_00,&exp,WAITING,memory_order_seq_cst);
    }
  }
  return bVar1;
}

Assistant:

bool execute(const TaskResult& ret) {
        TaskStatus exp = WAITING;
        TaskStatus desired = RUNNING;
        if (status.compare_exchange_strong(exp, desired)) {
            handler(ret);
            if (type == ONE_TIME) {
                status = DONE;
            } else {
                exp = RUNNING;
                desired = WAITING;
                status.compare_exchange_strong(exp, desired);
            }
            return true;
        }
        return false;
    }